

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

bool QOpenGLTexture::hasFeature(Feature feature)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  QByteArray *pQVar4;
  long *plVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  long in_FS_OFFSET;
  QSurfaceFormat f;
  QArrayData *local_90;
  QArrayData *local_78;
  QArrayData *local_60;
  QArrayData *local_48;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QByteArray *)QOpenGLContext::currentContext();
  if (pQVar4 == (QByteArray *)0x0) {
    hasFeature();
    bVar2 = 0;
    goto LAB_00154790;
  }
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  cVar1 = QOpenGLContext::isOpenGLES();
  if (cVar1 != '\0') goto LAB_00153e28;
  bVar2 = 0;
  if ((int)feature < 0x100) {
    if ((int)feature < 0x10) {
      bVar2 = 0;
      switch(feature) {
      case ImmutableStorage:
        uVar7 = QSurfaceFormat::version();
        bVar11 = 3 < (int)uVar7 && (1 < (int)((ulong)uVar7 >> 0x20) || (int)uVar7 != 4);
        bVar2 = 1;
        if (bVar11) {
LAB_00154170:
          bVar10 = false;
        }
        else {
          local_48 = (QArrayData *)0x0;
          cVar1 = QOpenGLContext::hasExtension(pQVar4);
          if (cVar1 != '\0') goto LAB_00154170;
          local_60 = (QArrayData *)0x0;
          bVar2 = QOpenGLContext::hasExtension(pQVar4);
          bVar10 = true;
        }
        if (bVar10) {
LAB_001547e0:
          if (local_60 != (QArrayData *)0x0) {
            LOCK();
            (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60,1,0x10);
            }
          }
        }
        break;
      case ImmutableMultisampleStorage:
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        bVar10 = 2 < (int)((ulong)uVar7 >> 0x20);
        bVar11 = 3 < iVar3 && (bVar10 || iVar3 != 4);
        bVar2 = 1;
        if (3 >= iVar3 || !bVar10 && iVar3 == 4) {
LAB_0015436e:
          local_48 = (QArrayData *)0x0;
          bVar2 = QOpenGLContext::hasExtension(pQVar4);
        }
        break;
      default:
        goto switchD_00153e5f_caseD_3;
      case TextureRectangle:
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        bVar10 = 0 < (int)((ulong)uVar7 >> 0x20);
        bVar11 = 1 < iVar3 && (bVar10 || iVar3 != 2);
        bVar2 = 1;
        if (1 >= iVar3 || !bVar10 && iVar3 == 2) goto LAB_0015436e;
        break;
      case TextureArrays:
        lVar8 = QSurfaceFormat::version();
        iVar3 = (int)lVar8;
        bVar11 = 2 < iVar3 && (-1 < lVar8 || iVar3 != 3);
        bVar2 = 1;
        if (2 >= iVar3 || -1 >= lVar8 && iVar3 == 3) goto LAB_0015436e;
      }
LAB_00154378:
      if (!bVar11) goto LAB_00154382;
    }
    else {
      if (0x3f < (int)feature) {
        if (feature == TextureBuffer) {
          lVar8 = QSurfaceFormat::version();
          iVar3 = (int)lVar8;
          bVar11 = 2 < iVar3 && (-1 < lVar8 || iVar3 != 3);
          bVar2 = 1;
          if (2 >= iVar3 || -1 >= lVar8 && iVar3 == 3) goto LAB_0015436e;
        }
        else {
          if (feature != TextureCubeMapArrays) goto switchD_00153e5f_caseD_3;
          lVar8 = QSurfaceFormat::version();
          iVar3 = (int)lVar8;
          bVar11 = 3 < iVar3 && (-1 < lVar8 || iVar3 != 4);
          bVar2 = 1;
          if (3 >= iVar3 || -1 >= lVar8 && iVar3 == 4) goto LAB_0015436e;
        }
        goto LAB_00154378;
      }
      if (feature == Texture3D) {
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        if (iVar3 < 1) goto LAB_00153e28;
        iVar9 = (int)((ulong)uVar7 >> 0x20);
        bVar10 = SBORROW4(iVar9,3);
        iVar9 = iVar9 + -3;
LAB_00154099:
        bVar10 = bVar10 == iVar9 < 0;
LAB_0015409d:
        bVar2 = bVar10 | iVar3 != 1;
      }
      else if (feature == TextureMultisample) {
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        bVar10 = 1 < (int)((ulong)uVar7 >> 0x20);
        bVar11 = 2 < iVar3 && (bVar10 || iVar3 != 3);
        bVar2 = 1;
        if (2 >= iVar3 || !bVar10 && iVar3 == 3) goto LAB_0015436e;
        goto LAB_00154378;
      }
    }
  }
  else {
    if (0xfff < (int)feature) {
      if ((int)feature < 0x4000) {
        if (feature == NPOTTextureRepeat) goto LAB_001540c4;
        if (feature == Texture1D) {
          uVar7 = QSurfaceFormat::version();
          iVar3 = (int)uVar7;
          if (0 < iVar3) {
            bVar10 = 0 < (int)((ulong)uVar7 >> 0x20);
            goto LAB_0015409d;
          }
LAB_00153e28:
          bVar2 = 0;
        }
      }
      else {
        if (feature == TextureComparisonOperators) {
          uVar7 = QSurfaceFormat::version();
          iVar3 = (int)uVar7;
          bVar10 = 4 < (int)((ulong)uVar7 >> 0x20);
          bVar11 = 0 < iVar3 && (bVar10 || iVar3 != 1);
          if (0 < iVar3 && (bVar10 || iVar3 != 1)) {
            bVar2 = 1;
            bVar10 = false;
          }
          else {
            local_48 = (QArrayData *)0x0;
            cVar1 = QOpenGLContext::hasExtension(pQVar4);
            bVar10 = false;
            bVar2 = 0;
            if (cVar1 != '\0') {
              local_60 = (QArrayData *)0x0;
              bVar2 = QOpenGLContext::hasExtension(pQVar4);
              bVar10 = true;
            }
          }
          if (!bVar10) goto LAB_00154378;
          goto LAB_001547e0;
        }
        if (feature == TextureMipMapLevel) {
          uVar7 = QSurfaceFormat::version();
          iVar3 = (int)uVar7;
          if (0 < iVar3) {
            iVar9 = (int)((ulong)uVar7 >> 0x20);
            bVar10 = SBORROW4(iVar9,2);
            iVar9 = iVar9 + -2;
            goto LAB_00154099;
          }
          goto LAB_00153e28;
        }
      }
      goto switchD_00153e5f_caseD_3;
    }
    if ((int)feature < 0x400) {
      if (feature == Swizzle) {
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        bVar10 = 2 < (int)((ulong)uVar7 >> 0x20);
        bVar11 = 2 < iVar3 && (bVar10 || iVar3 != 3);
        bVar2 = 1;
        if (2 >= iVar3 || !bVar10 && iVar3 == 3) goto LAB_0015436e;
      }
      else {
        if (feature != StencilTexturing) goto switchD_00153e5f_caseD_3;
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        bVar10 = 2 < (int)((ulong)uVar7 >> 0x20);
        bVar11 = 3 < iVar3 && (bVar10 || iVar3 != 4);
        bVar2 = 1;
        if (3 >= iVar3 || !bVar10 && iVar3 == 4) goto LAB_0015436e;
      }
      goto LAB_00154378;
    }
    if ((feature != AnisotropicFiltering) && (feature != NPOTTextures))
    goto switchD_00153e5f_caseD_3;
LAB_001540c4:
    local_48 = (QArrayData *)0x0;
    bVar2 = QOpenGLContext::hasExtension(pQVar4);
LAB_00154382:
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,1,0x10);
      }
    }
  }
switchD_00153e5f_caseD_3:
  cVar1 = QOpenGLContext::isOpenGLES();
  if (cVar1 == '\0') goto LAB_00154786;
  plVar5 = (long *)QOpenGLContext::functions();
  pcVar6 = (char *)(**(code **)(*plVar5 + 0xd0))(0x1f01);
  if ((int)feature < 0x100) {
    if ((int)feature < 8) {
      if (feature == ImmutableStorage) {
        lVar8 = QSurfaceFormat::version();
        iVar3 = (int)lVar8;
        if (2 < iVar3 && (-1 < lVar8 || iVar3 != 3)) {
LAB_001545d9:
          bVar10 = 2 >= iVar3 || -1 >= lVar8 && iVar3 == 3;
          if (pcVar6 == (char *)0x0) {
            bVar2 = true;
          }
          else {
            pcVar6 = strstr(pcVar6,"Mali");
            bVar2 = pcVar6 == (char *)0x0;
          }
        }
        else {
          local_78 = (QArrayData *)0x0;
          cVar1 = QOpenGLContext::hasExtension(pQVar4);
          if (cVar1 != '\0') goto LAB_001545d9;
          bVar10 = true;
          bVar2 = false;
        }
        if (bVar10) goto LAB_00154768;
      }
      else if (feature == ImmutableMultisampleStorage) {
LAB_00154479:
        uVar7 = QSurfaceFormat::version();
        if ((int)uVar7 < 3) {
          bVar2 = 0;
        }
        else {
          bVar2 = 0 < (int)((ulong)uVar7 >> 0x20) || (int)uVar7 != 3;
        }
      }
    }
    else {
      if (feature == TextureArrays) goto LAB_00154444;
      if (feature == Texture3D) {
        lVar8 = QSurfaceFormat::version();
        iVar3 = (int)lVar8;
        bVar10 = 2 < iVar3 && (-1 < lVar8 || iVar3 != 3);
        bVar2 = 1;
        if (2 >= iVar3 || -1 >= lVar8 && iVar3 == 3) goto LAB_0015466f;
        goto LAB_001546cd;
      }
      if (feature == TextureMultisample) goto LAB_00154479;
    }
  }
  else {
    if ((int)feature < 0x1000) {
      if (feature == Swizzle) {
LAB_00154444:
        lVar8 = QSurfaceFormat::version();
        bVar2 = (-1 < lVar8 || (int)lVar8 != 3) && 2 < (int)lVar8;
        goto LAB_00154786;
      }
      if (feature != AnisotropicFiltering) {
        if (feature != NPOTTextures) goto LAB_00154786;
        goto LAB_0015448f;
      }
      local_78 = (QArrayData *)0x0;
      bVar2 = QOpenGLContext::hasExtension(pQVar4);
    }
    else {
      if (feature == NPOTTextureRepeat) {
LAB_0015448f:
        lVar8 = QSurfaceFormat::version();
        bVar10 = 2 < (int)lVar8 && (-1 < lVar8 || (int)lVar8 != 3);
        bVar2 = 1;
        if (bVar10) {
LAB_00154591:
          bVar11 = false;
        }
        else {
          local_78 = (QArrayData *)0x0;
          cVar1 = QOpenGLContext::hasExtension(pQVar4);
          if (cVar1 != '\0') goto LAB_00154591;
          local_90 = (QArrayData *)0x0;
          bVar2 = QOpenGLContext::hasExtension(pQVar4);
          bVar11 = true;
        }
        if ((bVar11) && (local_90 != (QArrayData *)0x0)) {
          LOCK();
          (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90,1,0x10);
          }
        }
      }
      else {
        if (feature != TextureComparisonOperators) {
          if (feature != TextureMipMapLevel) goto LAB_00154786;
          goto LAB_00154444;
        }
        lVar8 = QSurfaceFormat::version();
        iVar3 = (int)lVar8;
        bVar10 = 2 < iVar3 && (-1 < lVar8 || iVar3 != 3);
        bVar2 = 1;
        if (2 >= iVar3 || -1 >= lVar8 && iVar3 == 3) {
LAB_0015466f:
          local_78 = (QArrayData *)0x0;
          bVar2 = QOpenGLContext::hasExtension(pQVar4);
        }
      }
LAB_001546cd:
      if (bVar10) goto LAB_00154786;
    }
LAB_00154768:
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,1,0x10);
      }
    }
  }
LAB_00154786:
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
LAB_00154790:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTexture::hasFeature(Feature feature)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::hasFeature() requires a valid current context");
        return false;
    }

    QSurfaceFormat f = ctx->format();

    bool supported = false;

#if !QT_CONFIG(opengles2)
    if (!ctx->isOpenGLES()) {
        switch (feature) {
        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage_multisample"));
            break;

        case TextureBuffer:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_buffer_object"));
            break;

        case StencilTexturing:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_stencil_texturing"));
            break;

        case ImmutableStorage:
            supported = f.version() >= std::pair(4, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage"));
            break;

        case TextureCubeMapArrays:
            supported = f.version() >= std::pair(4, 0)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_cube_map_array"));
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_swizzle"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_multisample"));
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_array"));
            break;

        case TextureRectangle:
            supported = f.version() >= std::pair(2, 1)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_rectangle"));
            break;

        case Texture3D:
            supported = f.version() >= std::pair(1, 3);
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            supported = f.version() >= std::pair(1, 1);
            break;

        case TextureComparisonOperators:
            // GL 1.4 and GL_ARB_shadow alone support only LEQUAL and GEQUAL;
            // since we're talking about history anyhow avoid to be extra pedantic
            // in the feature set, and simply claim supported if we have the full set of operators
            // (which has been added into 1.5 / GL_EXT_shadow_funcs).
            supported = f.version() >= std::pair(1, 5)
                    || (ctx->hasExtension(QByteArrayLiteral("GL_ARB_shadow"))
                        && ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_funcs")));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(1, 2);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    if (ctx->isOpenGLES())
#endif
    {
        const char *renderer = reinterpret_cast<const char *>(ctx->functions()->glGetString(GL_RENDERER));
        switch (feature) {
        case ImmutableStorage:
            supported = (f.version() >= std::pair(3, 0) || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage")))
                && !(renderer && strstr(renderer, "Mali")); // do not use on Mali: QTBUG-45106
            break;

        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureRectangle:
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0);
            break;

        case Texture3D:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_3D"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureBuffer:
            break;

        case TextureCubeMapArrays:
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 0);
            break;

        case StencilTexturing:
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = f.version() >= std::pair(3,0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_npot"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            break;

        case TextureComparisonOperators:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_samplers"));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(3, 0);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    return supported;
}